

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

size_t Curl_multissl_version(char *buffer,size_t size)

{
  size_t sVar1;
  char *pcVar2;
  size_t local_50;
  Curl_ssl *local_40;
  int local_34;
  int i;
  char *end;
  char *p;
  Curl_ssl *current;
  size_t size_local;
  char *buffer_local;
  
  if (Curl_ssl == &Curl_ssl_multi) {
    local_40 = available_backends[0];
  }
  else {
    local_40 = Curl_ssl;
  }
  if (local_40 != Curl_multissl_version::selected) {
    end = Curl_multissl_version::backends;
    Curl_multissl_version::selected = local_40;
    local_34 = 0;
    while (available_backends[local_34] != (Curl_ssl *)0x0 &&
           end <= Curl_multissl_version::backends + 0xc3) {
      if (local_34 != 0) {
        *end = ' ';
        end = end + 1;
      }
      if (Curl_multissl_version::selected != available_backends[local_34]) {
        *end = '(';
        end = end + 1;
      }
      sVar1 = (*available_backends[local_34]->version)
                        (end,(size_t)(Curl_multissl_version::backends + (0xc6 - (long)end)));
      pcVar2 = end + sVar1;
      end = pcVar2;
      if (Curl_multissl_version::selected != available_backends[local_34]) {
        end = pcVar2 + 1;
        *pcVar2 = ')';
      }
      local_34 = local_34 + 1;
    }
    *end = '\0';
    Curl_multissl_version::total = (size_t)(end + -0xadd720);
  }
  if (Curl_multissl_version::total < size) {
    memcpy(buffer,Curl_multissl_version::backends,Curl_multissl_version::total + 1);
  }
  else {
    memcpy(buffer,Curl_multissl_version::backends,size - 1);
    buffer[size - 1] = '\0';
  }
  if (size - 1 < Curl_multissl_version::total) {
    local_50 = size - 1;
  }
  else {
    local_50 = Curl_multissl_version::total;
  }
  return local_50;
}

Assistant:

static size_t Curl_multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t total;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    char *end = backends + sizeof(backends);
    int i;

    selected = current;

    for(i = 0; available_backends[i] && p < (end - 4); i++) {
      if(i)
        *(p++) = ' ';
      if(selected != available_backends[i])
        *(p++) = '(';
      p += available_backends[i]->version(p, end - p - 2);
      if(selected != available_backends[i])
        *(p++) = ')';
    }
    *p = '\0';
    total = p - backends;
  }

  if(size > total)
    memcpy(buffer, backends, total + 1);
  else {
    memcpy(buffer, backends, size - 1);
    buffer[size - 1] = '\0';
  }

  return CURLMIN(size - 1, total);
}